

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O0

bool __thiscall
Rml::DataControllerEvent::Initialize
          (DataControllerEvent *this,DataModel *model,Element *element,String *expression_str,
          String *modifier)

{
  code *pcVar1;
  bool bVar2;
  EventId EVar3;
  pointer this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  String local_78;
  undefined1 local_58 [8];
  DataExpressionInterface expr_interface;
  String *modifier_local;
  String *expression_str_local;
  Element *element_local;
  DataModel *model_local;
  DataControllerEvent *this_local;
  
  if ((element == (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataControllerDefault.cpp"
                     ,0x6b), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  MakeUnique<Rml::DataExpression,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expr_interface.event);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::operator=
            (&this->expression,
             (unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &expr_interface.event);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::~unique_ptr
            ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &expr_interface.event);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)local_58,model,element,(Event *)0x0);
  this_00 = ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
            operator->(&this->expression);
  bVar2 = DataExpression::Parse(this_00,(DataExpressionInterface *)local_58,true);
  if (bVar2) {
    EVar3 = EventSpecificationInterface::GetIdOrInsert(modifier);
    this->id = EVar3;
    if (this->id == Invalid) {
      uVar4 = ::std::__cxx11::string::c_str();
      Element::GetAddress_abi_cxx11_(&local_78,element,false,true);
      uVar5 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,
                   "Event type \'%s\' could not be recognized, while adding \'data-event\' to %s",
                   uVar4,uVar5);
      ::std::__cxx11::string::~string((string *)&local_78);
      this_local._7_1_ = false;
    }
    else {
      Element::AddEventListener(element,this->id,&this->super_EventListener,false);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DataControllerEvent::Initialize(DataModel& model, Element* element, const String& expression_str, const String& modifier)
{
	RMLUI_ASSERT(element);

	expression = MakeUnique<DataExpression>(expression_str);
	DataExpressionInterface expr_interface(&model, element);

	if (!expression->Parse(expr_interface, true))
		return false;

	id = EventSpecificationInterface::GetIdOrInsert(modifier);
	if (id == EventId::Invalid)
	{
		Log::Message(Log::LT_WARNING, "Event type '%s' could not be recognized, while adding 'data-event' to %s", modifier.c_str(),
			element->GetAddress().c_str());
		return false;
	}

	element->AddEventListener(id, this);

	return true;
}